

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O1

uint __thiscall
MovParsedH264TrackData::newBufferSize(MovParsedH264TrackData *this,uint8_t *buff,uint size)

{
  pointer pvVar1;
  uint uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *i;
  pointer pvVar3;
  undefined4 *puVar4;
  int iVar5;
  uint8_t *puVar6;
  int iVar7;
  ostringstream ss;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  ostringstream local_1a8 [376];
  
  iVar7 = 0;
  iVar5 = 0;
  if (size != 0) {
    puVar6 = buff + size;
    iVar5 = 0;
    do {
      if (puVar6 < buff + this->nal_length_size) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"MP4/MOV error: Invalid H.264/AVC frame at position ",0x33);
        std::ostream::_M_insert<long>((long)local_1a8);
        puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar4 = 0x3b6;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
        if (local_1c8 == &local_1b8) {
          puVar4[6] = local_1b8;
          puVar4[7] = uStack_1b4;
          puVar4[8] = uStack_1b0;
          puVar4[9] = uStack_1ac;
        }
        else {
          *(uint **)(puVar4 + 2) = local_1c8;
          *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1b4,local_1b8);
        }
        *(undefined8 *)(puVar4 + 4) = local_1c0;
        local_1c0 = 0;
        local_1b8 = local_1b8 & 0xffffff00;
        local_1c8 = &local_1b8;
        __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      uVar2 = getNalSize(this,buff);
      buff = buff + (ulong)this->nal_length_size + (ulong)uVar2;
      if (puVar6 < buff) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"MP4/MOV error: Invalid H.264/AVC frame at position ",0x33);
        std::ostream::_M_insert<long>((long)local_1a8);
        puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar4 = 0x3b6;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
        if (local_1e8 == &local_1d8) {
          puVar4[6] = local_1d8;
          puVar4[7] = uStack_1d4;
          puVar4[8] = uStack_1d0;
          puVar4[9] = uStack_1cc;
        }
        else {
          *(uint **)(puVar4 + 2) = local_1e8;
          *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1d4,local_1d8);
        }
        *(undefined8 *)(puVar4 + 4) = local_1e0;
        local_1d8 = local_1d8 & 0xffffff00;
        __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      iVar5 = iVar5 + 1;
    } while (buff < puVar6);
  }
  pvVar3 = (this->spsPpsList).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->spsPpsList).
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar3 != pvVar1) {
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (*(int *)&(pvVar3->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                      *(int *)&(pvVar3->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_start) + 4;
      pvVar3 = pvVar3 + 1;
    } while (pvVar3 != pvVar1);
  }
  return (4 - (uint)this->nal_length_size) * iVar5 + iVar7 + size;
}

Assistant:

unsigned newBufferSize(uint8_t* buff, const unsigned size) override
    {
        const uint8_t* end = buff + size;
        unsigned nalCnt = 0;
        while (buff < end)
        {
            if (buff + nal_length_size > end)
                THROW(ERR_MOV_PARSE,
                      "MP4/MOV error: Invalid H.264/AVC frame at position " << m_demuxer->getProcessedBytes())
            const uint32_t nalSize = getNalSize(buff);
            buff += nal_length_size;
            if (buff + nalSize > end)
                THROW(ERR_MOV_PARSE,
                      "MP4/MOV error: Invalid H.264/AVC frame at position " << m_demuxer->getProcessedBytes())
            buff += nalSize;
            ++nalCnt;
        }
        unsigned spsPpsSize = 0;
        for (auto& i : spsPpsList) spsPpsSize += static_cast<uint32_t>(i.size() + 4);

        return size + spsPpsSize + nalCnt * (4 - nal_length_size);
    }